

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O0

void __thiscall KmerList::uniq(KmerList *this)

{
  KMerNodeFreq_s *pKVar1;
  ulong *in_RDI;
  KMerNodeFreq_s *rptr;
  KMerNodeFreq_s *endptr;
  KMerNodeFreq_s *wptr;
  size_t in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool bVar2;
  KMerNodeFreq_s *local_20;
  KMerNodeFreq_s *local_10;
  
  local_10 = (KMerNodeFreq_s *)*in_RDI;
  pKVar1 = (KMerNodeFreq_s *)(*in_RDI + in_RDI[1] * 0x11);
  local_20 = (KMerNodeFreq_s *)*in_RDI;
  while (local_20 < pKVar1) {
    *(long *)&local_10->kdata = (long)local_20->kdata;
    *(undefined8 *)((long)&local_10->kdata + 8) = *(undefined8 *)((long)&local_20->kdata + 8);
    local_10->count = local_20->count;
    while( true ) {
      local_20 = local_20 + 1;
      bVar2 = false;
      if (local_20 < pKVar1) {
        bVar2 = KMerNodeFreq_s::operator==(local_10,local_20);
      }
      if (bVar2 == false) break;
      KMerNodeFreq_s::combine(local_10,local_20);
    }
    local_10 = local_10 + 1;
    in_stack_ffffffffffffffd7 = 0;
  }
  resize((KmerList *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
         in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void KmerList::uniq() {
    auto wptr = kmers;
    auto endptr = kmers + size;
    for (auto rptr = kmers; rptr < endptr; ++wptr) {
        *wptr = *rptr;
        ++rptr;
        while (rptr < endptr and *wptr == *rptr) {
            wptr->combine(*rptr);
            ++rptr;
        }
    }
    resize(wptr - kmers);
}